

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryReader::~BinaryRegistryReader(BinaryRegistryReader *this)

{
  BinaryRegistryReader *this_local;
  
  de::details::
  MovePtr<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  ::~MovePtr(&this->m_binaryIndex);
  std::__cxx11::string::~string((string *)&this->m_srcPath);
  return;
}

Assistant:

BinaryRegistryReader::~BinaryRegistryReader (void)
{
}